

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::store(Forth *this)

{
  uint pointer;
  uint value;
  uint x;
  AAddr aaddr;
  Forth *this_local;
  
  requireDStackDepth(this,2,"!");
  pointer = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  value = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  setDataCell(this,pointer,value);
  return;
}

Assistant:

void store() {
			REQUIRE_DSTACK_DEPTH(2, "!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "!");
			auto x = dStack.getTop(); pop();
			setDataCell( aaddr , x );
		}